

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles2::Functional::CompressedCubeFormatCase::testFace
          (CompressedCubeFormatCase *this,CubeFace face)

{
  ostringstream *this_00;
  RenderContext *context;
  TextureCube *pTVar1;
  pointer texCoord_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  CubeFace face_00;
  uint uVar12;
  RandomViewport viewport;
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  RandomViewport local_2d0;
  TextureFormat local_2c0;
  long local_2b8;
  Surface local_2b0;
  vector<float,_std::allocator<float>_> local_298;
  ulong local_278;
  Surface local_270;
  TextureCubeView local_258;
  Sampler local_218;
  SurfaceAccess local_1d0;
  undefined1 local_1b0 [384];
  long lVar7;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_2c0 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar6 = (this->m_texture->m_refTexture).m_size;
  dVar5 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  local_278 = (ulong)face;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_2d0,(RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar6,iVar6,dVar5 + face);
  tcu::Surface::Surface(&local_2b0,local_2d0.width,local_2d0.height);
  tcu::Surface::Surface(&local_270,local_2d0.width,local_2d0.height);
  local_218.wrapS = CLAMP_TO_EDGE;
  local_218.wrapT = CLAMP_TO_EDGE;
  local_218.wrapR = CLAMP_TO_EDGE;
  local_218.minFilter = NEAREST;
  local_218.magFilter = NEAREST;
  local_218.lodThreshold = 0.0;
  local_218.normalizedCoords = true;
  local_218.depthStencilMode = MODE_DEPTH;
  local_218.compare = COMPAREMODE_NONE;
  local_218.compareChannel = 0;
  local_218.borderColor.v.uData[0]._0_1_ = 0;
  local_218.borderColor.v._1_7_ = 0;
  local_218.borderColor.v.uData[2]._0_1_ = 0;
  local_218._45_8_ = 0;
  local_2b8 = CONCAT44(extraout_var,iVar3);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar7 = CONCAT44(extraout_var_01,iVar6);
  bVar9 = 8 - *(char *)(lVar7 + 8);
  uVar12 = 0;
  if (0 < *(int *)(lVar7 + 0x14)) {
    uVar12 = 0x1000000 << (8U - (char)*(int *)(lVar7 + 0x14) & 0x1f);
  }
  uVar8 = 0x100 << (8U - *(char *)(lVar7 + 0xc) & 0x1f) | 1 << (bVar9 & 0x1f);
  uVar12 = 0x10000 << (8U - *(char *)(lVar7 + 0x10) & 0x1f) | uVar8 | uVar12;
  uVar10 = 1 << (bVar9 & 0x1f) & 0xff;
  if (0xfd < uVar10) {
    uVar10 = 0xfe;
  }
  uVar8 = uVar8 >> 8 & 0xff;
  if (0xfd < uVar8) {
    uVar8 = 0xfe;
  }
  uVar11 = uVar12 >> 0x10 & 0xff;
  if (0xfd < uVar11) {
    uVar11 = 0xfe;
  }
  uVar12 = uVar12 >> 0x18;
  if (0xfd < uVar12) {
    uVar12 = 0xfe;
  }
  local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  face_00 = (CubeFace)local_278;
  glu::TextureTestUtil::computeQuadTexCoordCube(&local_298,face_00);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_4_ = local_2c0.order;
  local_1b0._4_4_ = local_2c0.type;
  std::__cxx11::ostringstream::ostringstream(this_00);
  tcu::operator<<((ostream *)this_00,face_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  lVar7 = local_2b8;
  (**(code **)(local_2b8 + 0x1a00))(local_2d0.x,local_2d0.y,local_2d0.width,local_2d0.height);
  (**(code **)(lVar7 + 8))(0x84c0);
  (**(code **)(lVar7 + 0xb8))(0x8513,this->m_texture->m_glTexture);
  (**(code **)(lVar7 + 0x1360))(0x8513,0x2802,0x812f);
  (**(code **)(lVar7 + 0x1360))(0x8513,0x2803,0x812f);
  (**(code **)(lVar7 + 0x1360))(0x8513,0x2801,0x2600);
  (**(code **)(lVar7 + 0x1360))(0x8513,0x2800,0x2600);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0x24c);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,TEXTURETYPE_CUBE);
  context = this->m_renderCtx;
  local_258.m_numLevels = 8;
  local_258._4_4_ = 3;
  if ((void *)local_2b0.m_pixels.m_cap != (void *)0x0) {
    local_2b0.m_pixels.m_cap = (size_t)local_2b0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_258,local_2b0.m_width,
             local_2b0.m_height,1,(void *)local_2b0.m_pixels.m_cap);
  glu::readPixels(context,local_2d0.x,local_2d0.y,(PixelBufferAccess *)local_1b0);
  dVar5 = (**(code **)(local_2b8 + 0x800))();
  glu::checkError(dVar5,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0x250);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            (&local_1d0,&local_270,(PixelFormat *)(CONCAT44(extraout_var_02,iVar6) + 8));
  texCoord_00 = local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  pTVar1 = this->m_texture;
  local_258.m_levels[5] = (pTVar1->m_refTexture).m_view.m_levels[5];
  local_258.m_numLevels = (pTVar1->m_refTexture).m_view.m_numLevels;
  local_258._4_4_ = *(undefined4 *)&(pTVar1->m_refTexture).m_view.field_0x4;
  local_258.m_levels[0] = (pTVar1->m_refTexture).m_view.m_levels[0];
  local_258.m_levels[1] = (pTVar1->m_refTexture).m_view.m_levels[1];
  local_258.m_levels[2] = (pTVar1->m_refTexture).m_view.m_levels[2];
  local_258.m_levels[3] = (pTVar1->m_refTexture).m_view.m_levels[3];
  local_258.m_levels[4] = (pTVar1->m_refTexture).m_view.m_levels[4];
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_1b0,TEXTURETYPE_CUBE,&local_218,LODMODE_EXACT);
  glu::TextureTestUtil::sampleTexture
            (&local_1d0,&local_258,texCoord_00,(ReferenceParams *)local_1b0);
  bVar2 = glu::TextureTestUtil::compareImages
                    ((TestLog *)local_2c0,&local_270,&local_2b0,
                     (RGBA)(uVar12 * 0x1000000 + (uVar11 << 0x10 | uVar8 * 0x100 + uVar10) +
                           0x1010101));
  if (local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_270);
  tcu::Surface::~Surface(&local_2b0);
  return bVar2;
}

Assistant:

bool CompressedCubeFormatCase::testFace (tcu::CubeFace face)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_texture->getRefTexture().getSize(), m_texture->getRefTexture().getSize(), deStringHash(getName())+(deUint32)face);
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	Sampler					sampler				(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;

	computeQuadTexCoordCube(texCoord, face);

	// \todo [2011-10-28 pyry] Image set name / section?
	log << TestLog::Message << face << TestLog::EndMessage;

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	m_renderer.renderQuad(0, &texCoord[0], TEXTURETYPE_CUBE);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], ReferenceParams(TEXTURETYPE_CUBE, sampler));

	// Compare and log.
	return compareImages(log, referenceFrame, renderedFrame, threshold);
}